

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errno.cc
# Opt level: O2

int bio_errno_should_retry(int return_value)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar2 = 0;
  if (return_value == -1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    iVar2 = 1;
    if ((((0x2c < iVar1 - 0x47U) || ((0x101000000001U >> ((ulong)(iVar1 - 0x47U) & 0x3f) & 1) == 0))
        && (iVar1 != 4)) && (iVar1 != 0xb)) {
      return (int)(iVar1 == 0x72);
    }
  }
  return iVar2;
}

Assistant:

int bio_errno_should_retry(int return_value) {
  if (return_value != -1) {
    return 0;
  }

  return
#ifdef EWOULDBLOCK
      errno == EWOULDBLOCK ||
#endif
#ifdef ENOTCONN
      errno == ENOTCONN ||
#endif
#ifdef EINTR
      errno == EINTR ||
#endif
#ifdef EAGAIN
      errno == EAGAIN ||
#endif
#ifdef EPROTO
      errno == EPROTO ||
#endif
#ifdef EINPROGRESS
      errno == EINPROGRESS ||
#endif
#ifdef EALREADY
      errno == EALREADY ||
#endif
      0;
}